

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
SolverAppTest_ParseOptionsBeforeReadingProblem_Test::
SolverAppTest_ParseOptionsBeforeReadingProblem_Test
          (SolverAppTest_ParseOptionsBeforeReadingProblem_Test *this)

{
  undefined8 *in_RDI;
  SolverAppTest *unaff_retaddr;
  
  SolverAppTest::SolverAppTest(unaff_retaddr);
  *in_RDI = &PTR__SolverAppTest_ParseOptionsBeforeReadingProblem_Test_00399570;
  return;
}

Assistant:

TEST_F(SolverAppTest, ParseOptionsBeforeReadingProblem) {
  AddOption();
  testing::InSequence sequence;
  EXPECT_CALL(handler_, OnOption()).WillOnce(Return(true));
  EXPECT_CALL(app_.reader(), DoRead(_, _, _));
  EXPECT_EQ(0, app_.Run(Args("test", "-w", "testproblem")));
}